

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

Node * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_false>::AlternativePass1
          (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this)

{
  undefined1 *puVar1;
  EncodedChar EVar2;
  code *pcVar3;
  _func_int **pp_Var4;
  bool bVar5;
  int iVar6;
  undefined4 *puVar7;
  MatchLiteralNode *pMVar8;
  MatchLiteralNode *pMVar9;
  MatchLiteralNode *pMVar10;
  Node *pNVar11;
  MatchCharNode local_e0;
  MatchLiteralNode local_98;
  undefined4 *local_50;
  _func_int **local_48;
  MatchLiteralNode *local_40;
  bool local_31 [8];
  bool previousSurrogatePart;
  
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar5) goto LAB_00ebb4c0;
    *puVar7 = 0;
  }
  EVar2 = *this->next;
  if (((EVar2 == L'|') || (EVar2 == L')')) || ((EVar2 == L'\0' && (this->inputLim <= this->next))))
  {
    pNVar11 = (Node *)new<Memory::ArenaAllocator>(0x38,this->ctAllocator,0x366bee);
    pNVar11->tag = Empty;
    pNVar11->features = 0;
    *(uint *)&pNVar11->field_0xc = *(uint *)&pNVar11->field_0xc & 0xffff8000;
    pNVar11->firstSet = (CharSet<char16_t> *)0x0;
    pNVar11->followSet = (CharSet<char16_t> *)0x0;
    (pNVar11->prevConsumes).lower = 0;
    *(undefined8 *)&(pNVar11->prevConsumes).upper = 0xffffffff;
    *(undefined8 *)&(pNVar11->thisConsumes).upper = 0xffffffff;
    (pNVar11->followConsumes).upper = 0xffffffff;
    pNVar11->_vptr_Node = (_func_int **)&PTR_LiteralLength_01558c50;
    return pNVar11;
  }
  local_e0.super_Node.tag = MatchChar;
  local_e0.super_Node.features = 0;
  local_e0.super_Node._12_4_ = local_e0.super_Node._12_4_ & 0xffff8000;
  local_e0.super_Node.firstSet = (CharSet<char16_t> *)0x0;
  local_e0.super_Node.followSet = (CharSet<char16_t> *)0x0;
  local_e0.super_Node.prevConsumes.lower = 0;
  local_e0.super_Node.prevConsumes.upper = 0xffffffff;
  local_e0.super_Node.thisConsumes.lower = 0;
  local_e0.super_Node.thisConsumes.upper = 0xffffffff;
  local_e0.super_Node.followConsumes.lower = 0;
  local_e0.super_Node.followConsumes.upper = 0xffffffff;
  local_e0.super_Node._vptr_Node = (_func_int **)&PTR_LiteralLength_01558ef0;
  local_e0.cs[0] = L'\0';
  local_e0.cs[1] = L'\0';
  local_e0.cs[2] = L'\0';
  local_e0.cs[3] = L'\0';
  local_98.super_Node.tag = MatchLiteral;
  local_98.super_Node.features = 0;
  local_98.super_Node._12_4_ = local_98.super_Node._12_4_ & 0xffff8000;
  local_e0.isEquivClass = false;
  local_98.super_Node.firstSet = (CharSet<char16_t> *)0x0;
  local_98.super_Node.followSet = (CharSet<char16_t> *)0x0;
  local_98.super_Node.prevConsumes.lower = 0;
  local_98.super_Node.prevConsumes.upper = 0xffffffff;
  local_98.super_Node.thisConsumes.lower = 0;
  local_98.super_Node.thisConsumes.upper = 0xffffffff;
  local_98.super_Node.followConsumes.lower = 0;
  local_98.super_Node.followConsumes.upper = 0xffffffff;
  local_98.super_Node._vptr_Node = (_func_int **)&PTR_LiteralLength_01558e10;
  local_98.offset = 0;
  local_98.length = 0;
  local_98.isEquivClass = false;
  local_31[0] = false;
  pMVar8 = (MatchLiteralNode *)TermPass1(this,&local_e0,local_31);
  if (pMVar8 == (MatchLiteralNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x389,"(node != nullptr)","node != nullptr");
    if (!bVar5) {
LAB_00ebb4c0:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  pMVar10 = pMVar8;
  if ((pMVar8->super_Node).tag == Concat) {
    do {
      pMVar9 = pMVar10;
      pMVar10 = *(MatchLiteralNode **)&pMVar9->isEquivClass;
    } while (*(MatchLiteralNode **)&pMVar9->isEquivClass != (MatchLiteralNode *)0x0);
  }
  else {
    pMVar9 = (MatchLiteralNode *)0x0;
  }
  local_40 = pMVar8;
  if (pMVar9 == (MatchLiteralNode *)0x0) {
    iVar6 = (**(pMVar8->super_Node)._vptr_Node)(pMVar8);
    if (iVar6 != 0) {
      AccumLiteral(this,&local_98,(Node *)pMVar8);
      local_40 = &local_98;
    }
  }
  else {
    iVar6 = (**(code **)**(undefined8 **)&pMVar9->offset)();
    if (iVar6 != 0) {
      AccumLiteral(this,&local_98,*(Node **)&pMVar9->offset);
      *(MatchLiteralNode **)&pMVar9->offset = &local_98;
    }
  }
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  local_48 = (_func_int **)&PTR_LiteralLength_015590b0;
  local_50 = puVar7;
LAB_00ebaddb:
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar5) goto LAB_00ebb4c0;
    *puVar7 = 0;
  }
  EVar2 = *this->next;
  if (EVar2 == L'\0') {
    if (this->inputLim <= this->next) {
LAB_00ebb41d:
      if (pMVar9 == (MatchLiteralNode *)0x0) {
        pMVar8 = (MatchLiteralNode *)FinalTerm(this,&local_40->super_Node,&local_98);
      }
      else {
        pNVar11 = FinalTerm(this,*(Node **)&pMVar9->offset,&local_98);
        *(Node **)&pMVar9->offset = pNVar11;
        pMVar8 = local_40;
      }
      if (local_98.length == 0) {
        return &pMVar8->super_Node;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x406,"(deferredLiteralNode.length == 0)",
                         "deferredLiteralNode.length == 0");
      if (bVar5) {
        *puVar7 = 0;
        return &pMVar8->super_Node;
      }
      goto LAB_00ebb4c0;
    }
  }
  else if ((EVar2 == L')') || (EVar2 == L'|')) goto LAB_00ebb41d;
  pMVar8 = (MatchLiteralNode *)TermPass1(this,&local_e0,local_31);
  if (pMVar8 == (MatchLiteralNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x3a9,"(next != nullptr)","next != nullptr");
    if (!bVar5) goto LAB_00ebb4c0;
    *puVar7 = 0;
  }
  iVar6 = (**(pMVar8->super_Node)._vptr_Node)(pMVar8);
  if (iVar6 == 0) {
    if ((pMVar8->super_Node).tag == Concat) {
      iVar6 = (**(code **)**(undefined8 **)&pMVar8->offset)();
      if ((iVar6 != 0) &&
         (((pMVar9 == (MatchLiteralNode *)0x0 && (local_40 == &local_98)) ||
          ((pMVar9 != (MatchLiteralNode *)0x0 &&
           (*(MatchLiteralNode **)&pMVar9->offset == &local_98)))))) {
        AccumLiteral(this,&local_98,*(Node **)&pMVar8->offset);
        pMVar8 = *(MatchLiteralNode **)&pMVar8->isEquivClass;
        if (pMVar8 == (MatchLiteralNode *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x3d2,"(nextList != 0)","nextList != 0");
          if (!bVar5) goto LAB_00ebb4c0;
          *puVar7 = 0;
        }
        iVar6 = (**(code **)**(undefined8 **)&pMVar8->offset)();
        if (iVar6 != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x3d4,"(nextList->head->LiteralLength() == 0)",
                             "nextList->head->LiteralLength() == 0");
          if (!bVar5) goto LAB_00ebb4c0;
          *puVar7 = 0;
        }
      }
      if (pMVar9 == (MatchLiteralNode *)0x0) {
        pMVar9 = (MatchLiteralNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
        pNVar11 = FinalTerm(this,&local_40->super_Node,&local_98);
        (pMVar9->super_Node).tag = Concat;
        (pMVar9->super_Node).features = 0;
        puVar1 = &(pMVar9->super_Node).field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
        (pMVar9->super_Node).firstSet = (CharSet<char16_t> *)0x0;
        (pMVar9->super_Node).followSet = (CharSet<char16_t> *)0x0;
        (pMVar9->super_Node).prevConsumes.lower = 0;
        *(undefined8 *)&(pMVar9->super_Node).prevConsumes.upper = 0xffffffff;
        *(undefined8 *)&(pMVar9->super_Node).thisConsumes.upper = 0xffffffff;
        (pMVar9->super_Node).followConsumes.upper = 0xffffffff;
        (pMVar9->super_Node)._vptr_Node = local_48;
        *(Node **)&pMVar9->offset = pNVar11;
        local_40 = pMVar9;
      }
      else {
        pNVar11 = FinalTerm(this,*(Node **)&pMVar9->offset,&local_98);
        *(Node **)&pMVar9->offset = pNVar11;
      }
      *(MatchLiteralNode **)&pMVar9->isEquivClass = pMVar8;
      if (pMVar8 == (MatchLiteralNode *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x3e0,"(nextList != nullptr)","nextList != nullptr");
        if (!bVar5) goto LAB_00ebb4c0;
        *puVar7 = 0;
      }
      do {
        pMVar9 = pMVar8;
        pMVar8 = *(MatchLiteralNode **)&pMVar9->isEquivClass;
      } while (*(MatchLiteralNode **)&pMVar9->isEquivClass != (MatchLiteralNode *)0x0);
      if (local_98.length != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x3e5,"(deferredLiteralNode.length == 0)",
                           "deferredLiteralNode.length == 0");
        if (!bVar5) goto LAB_00ebb4c0;
        *puVar7 = 0;
      }
      if (pMVar9 == (MatchLiteralNode *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,999,"(last != nullptr)","last != nullptr");
        if (!bVar5) goto LAB_00ebb4c0;
        *puVar7 = 0;
      }
      iVar6 = (**(code **)**(undefined8 **)&pMVar9->offset)();
      if (iVar6 != 0) {
        AccumLiteral(this,&local_98,*(Node **)&pMVar9->offset);
        *(MatchLiteralNode **)&pMVar9->offset = &local_98;
      }
    }
    else {
      pMVar10 = (MatchLiteralNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
      pp_Var4 = local_48;
      (pMVar10->super_Node).tag = Concat;
      (pMVar10->super_Node).features = 0;
      puVar1 = &(pMVar10->super_Node).field_0xc;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
      (pMVar10->super_Node).firstSet = (CharSet<char16_t> *)0x0;
      (pMVar10->super_Node).followSet = (CharSet<char16_t> *)0x0;
      (pMVar10->super_Node).prevConsumes.lower = 0;
      *(undefined8 *)&(pMVar10->super_Node).prevConsumes.upper = 0xffffffff;
      *(undefined8 *)&(pMVar10->super_Node).thisConsumes.upper = 0xffffffff;
      (pMVar10->super_Node).followConsumes.upper = 0xffffffff;
      (pMVar10->super_Node)._vptr_Node = local_48;
      *(MatchLiteralNode **)&pMVar10->offset = pMVar8;
      *(undefined8 *)&pMVar10->isEquivClass = 0;
      if (pMVar9 == (MatchLiteralNode *)0x0) {
        pMVar9 = (MatchLiteralNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
        pNVar11 = FinalTerm(this,&local_40->super_Node,&local_98);
        (pMVar9->super_Node).tag = Concat;
        (pMVar9->super_Node).features = 0;
        puVar1 = &(pMVar9->super_Node).field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
        (pMVar9->super_Node).firstSet = (CharSet<char16_t> *)0x0;
        (pMVar9->super_Node).followSet = (CharSet<char16_t> *)0x0;
        (pMVar9->super_Node).prevConsumes.lower = 0;
        *(undefined8 *)&(pMVar9->super_Node).prevConsumes.upper = 0xffffffff;
        *(undefined8 *)&(pMVar9->super_Node).thisConsumes.upper = 0xffffffff;
        (pMVar9->super_Node).followConsumes.upper = 0xffffffff;
        (pMVar9->super_Node)._vptr_Node = pp_Var4;
        *(Node **)&pMVar9->offset = pNVar11;
        local_40 = pMVar9;
      }
      else {
        pNVar11 = FinalTerm(this,*(Node **)&pMVar9->offset,&local_98);
        *(Node **)&pMVar9->offset = pNVar11;
      }
      puVar7 = local_50;
      *(MatchLiteralNode **)&pMVar9->isEquivClass = pMVar10;
      pMVar9 = pMVar10;
      if (local_98.length != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x3fe,"(deferredLiteralNode.length == 0)",
                           "deferredLiteralNode.length == 0");
        if (!bVar5) goto LAB_00ebb4c0;
        *puVar7 = 0;
      }
    }
  }
  else {
    AccumLiteral(this,&local_98,(Node *)pMVar8);
    if (pMVar9 == (MatchLiteralNode *)0x0) {
      pMVar9 = (MatchLiteralNode *)0x0;
      if (local_40 != &local_98) {
        pMVar9 = (MatchLiteralNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
        pp_Var4 = local_48;
        (pMVar9->super_Node).tag = Concat;
        (pMVar9->super_Node).features = 0;
        puVar1 = &(pMVar9->super_Node).field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
        (pMVar9->super_Node).firstSet = (CharSet<char16_t> *)0x0;
        (pMVar9->super_Node).followSet = (CharSet<char16_t> *)0x0;
        (pMVar9->super_Node).prevConsumes.lower = 0;
        *(undefined8 *)&(pMVar9->super_Node).prevConsumes.upper = 0xffffffff;
        *(undefined8 *)&(pMVar9->super_Node).thisConsumes.upper = 0xffffffff;
        (pMVar9->super_Node).followConsumes.upper = 0xffffffff;
        (pMVar9->super_Node)._vptr_Node = local_48;
        *(MatchLiteralNode **)&pMVar9->offset = &local_98;
        *(undefined8 *)&pMVar9->isEquivClass = 0;
        pMVar8 = (MatchLiteralNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
        (pMVar8->super_Node).tag = Concat;
        (pMVar8->super_Node).features = 0;
        puVar1 = &(pMVar8->super_Node).field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
        (pMVar8->super_Node).firstSet = (CharSet<char16_t> *)0x0;
        (pMVar8->super_Node).followSet = (CharSet<char16_t> *)0x0;
        (pMVar8->super_Node).prevConsumes.lower = 0;
        *(undefined8 *)&(pMVar8->super_Node).prevConsumes.upper = 0xffffffff;
        *(undefined8 *)&(pMVar8->super_Node).thisConsumes.upper = 0xffffffff;
        (pMVar8->super_Node).followConsumes.upper = 0xffffffff;
        (pMVar8->super_Node)._vptr_Node = pp_Var4;
        *(MatchLiteralNode **)&pMVar8->offset = local_40;
        *(MatchLiteralNode **)&pMVar8->isEquivClass = pMVar9;
        local_40 = pMVar8;
      }
    }
    else if (*(MatchLiteralNode **)&pMVar9->offset != &local_98) {
      pMVar8 = (MatchLiteralNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
      (pMVar8->super_Node).tag = Concat;
      (pMVar8->super_Node).features = 0;
      puVar1 = &(pMVar8->super_Node).field_0xc;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
      (pMVar8->super_Node).firstSet = (CharSet<char16_t> *)0x0;
      (pMVar8->super_Node).followSet = (CharSet<char16_t> *)0x0;
      (pMVar8->super_Node).prevConsumes.lower = 0;
      *(undefined8 *)&(pMVar8->super_Node).prevConsumes.upper = 0xffffffff;
      *(undefined8 *)&(pMVar8->super_Node).thisConsumes.upper = 0xffffffff;
      (pMVar8->super_Node).followConsumes.upper = 0xffffffff;
      (pMVar8->super_Node)._vptr_Node = local_48;
      *(MatchLiteralNode **)&pMVar8->offset = &local_98;
      *(undefined8 *)&pMVar8->isEquivClass = 0;
      *(MatchLiteralNode **)&pMVar9->isEquivClass = pMVar8;
      pMVar9 = pMVar8;
    }
  }
  goto LAB_00ebaddb;
}

Assistant:

Node* Parser<P, IsLiteral>::AlternativePass1()
    {
        if (IsEndOfAlternative())
            return Anew(ctAllocator, SimpleNode, Node::Empty);

        MatchCharNode deferredCharNode(0);
        MatchLiteralNode deferredLiteralNode(0, 0);

        // Maintain the invariants:
        //  - concat lists have two or more items
        //  - concat list items are never concat lists
        //  - a concat list never contains two consecutive match-character/match-literal nodes
        bool previousSurrogatePart = false;
        Node* node = TermPass1(&deferredCharNode, previousSurrogatePart);
        AnalysisAssert(node != nullptr);
        ConcatNode* last = 0;
        // First node may be a concat
        if (node->tag == Node::Concat)
        {
            last = (ConcatNode*)node;
            while (last->tail != 0)
                last = last->tail;
        }

        if (last == 0)
        {
            if (node->LiteralLength() > 0)
            {
                // Begin a new literal
                AccumLiteral(&deferredLiteralNode, node);
                node = &deferredLiteralNode;
            }
        }
        else
        {
            if (last->head->LiteralLength() > 0)
            {
                // Begin a new literal
                AccumLiteral(&deferredLiteralNode, last->head);
                last->head = &deferredLiteralNode;
            }
        }

        while (!IsEndOfAlternative())
        {
            Node* next = TermPass1(&deferredCharNode, previousSurrogatePart);
            AnalysisAssert(next != nullptr);
            if (next->LiteralLength() > 0)
            {
                // Begin a new literal or grow the existing literal
                AccumLiteral(&deferredLiteralNode, next);
                if (last == 0)
                {
                    if (node != &deferredLiteralNode)
                    {
                        // So far we have first item and the current literal
                        ConcatNode* cons = Anew(ctAllocator, ConcatNode, &deferredLiteralNode, 0);
                        node = Anew(ctAllocator, ConcatNode, node, cons);
                        last = cons;
                    }
                    // else: keep growing first literal
                }
                else
                {
                    if (last->head != &deferredLiteralNode)
                    {
                        // Append a new literal node
                        ConcatNode* cons = Anew(ctAllocator, ConcatNode, &deferredLiteralNode, 0);
                        last->tail = cons;
                        last = cons;
                    }
                    // else: keep growing current literal
                }
            }
            else if (next->tag == Node::Concat)
            {
                // Append this list to accumulated list
                ConcatNode* nextList = (ConcatNode*)next;
                if (nextList->head->LiteralLength() > 0 &&
                    ((last == 0 && node == &deferredLiteralNode) ||
                     (last != 0 && last->head == &deferredLiteralNode)))
                {
                    // Absorb the next character or literal into the current literal
                    // (may leave a gab in litbuf)
                    AccumLiteral(&deferredLiteralNode, nextList->head);
                    nextList = nextList->tail;
                    // List has at least two items
                    AnalysisAssert(nextList != 0);
                    // List should be in canonical form, so no consecutive chars/literals
                    Assert(nextList->head->LiteralLength() == 0);
                }
                if (last == 0)
                    node = Anew(ctAllocator, ConcatNode, FinalTerm(node, &deferredLiteralNode), nextList);
                else
                {
                    last->head = FinalTerm(last->head, &deferredLiteralNode);
                    last->tail = nextList;
                }
                // NextList can't be nullptr, since it was last set as next, which
                // was dereferenced, or it was set on a path that already has this
                // analysis assert.
                AnalysisAssert(nextList != nullptr);
                while (nextList->tail != 0)
                    nextList = nextList->tail;
                last = nextList;
                // No outstanding literals
                Assert(deferredLiteralNode.length == 0);
                // We just set this from nextList, which we know is not nullptr.
                AnalysisAssert(last != nullptr);
                if (last->head->LiteralLength() > 0)
                {
                    // If the list ends with a literal, transfer it into deferredLiteralNode
                    // so we can continue accumulating (won't leave a gab in litbuf)
                    AccumLiteral(&deferredLiteralNode, last->head);
                    // Can discard MatchLiteralNode since it lives in compile-time allocator
                    last->head = &deferredLiteralNode;
                }
            }
            else
            {
                // Append this node to accumulated list
                ConcatNode* cons = Anew(ctAllocator, ConcatNode, next, 0);
                if (last == 0)
                    node = Anew(ctAllocator, ConcatNode, FinalTerm(node, &deferredLiteralNode), cons);
                else
                {
                    last->head = FinalTerm(last->head, &deferredLiteralNode);
                    last->tail = cons;
                }
                last = cons;
                // No outstanding literals
                Assert(deferredLiteralNode.length == 0);
            }
        }
        if (last == 0)
            node = FinalTerm(node, &deferredLiteralNode);
        else
            last->head = FinalTerm(last->head, &deferredLiteralNode);
        // No outstanding literals
        Assert(deferredLiteralNode.length == 0);

        return node;
    }